

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void print_leaf_node(char *node)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  ostream *poVar4;
  uint local_18;
  uint32_t key;
  uint32_t i;
  uint32_t numCells;
  char *node_local;
  
  puVar3 = leaf_node_num_cells(node);
  uVar1 = *puVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"leaf (size ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,")");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    puVar3 = leaf_node_key(node,local_18);
    uVar2 = *puVar3;
    poVar4 = std::operator<<((ostream *)&std::cout,"  - ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
    poVar4 = std::operator<<(poVar4," : ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print_leaf_node(char *node) {
	uint32_t numCells = *(leaf_node_num_cells(node));
	std::cout<<"leaf (size " << numCells << ")" << std::endl;
	for (uint32_t i = 0; i < numCells; ++i) {
		uint32_t key = *leaf_node_key(node, i);
		std::cout<<"  - " << i << " : " << key << std::endl;
	}
}